

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O2

bool __thiscall
Clasp::PBBuilder::addConstraint
          (PBBuilder *this,WeightLitVec *lits,weight_t bound,bool eq,weight_t cw)

{
  pointer ppVar1;
  bool bVar2;
  uint32 uVar3;
  ulong uVar4;
  int iVar5;
  Literal W;
  CPair CVar6;
  
  bVar2 = SharedContext::ok((this->super_ProgramBuilder).ctx_);
  W.rep_ = 0;
  if (bVar2) {
    if (0 < cw) {
      if ((lits->ebo_).size == 1) {
        ppVar1 = (lits->ebo_).buf;
        iVar5 = ppVar1->second;
        if (iVar5 < 0) {
          bound = bound - iVar5;
          iVar5 = -iVar5;
          ppVar1->second = iVar5;
          (ppVar1->first).rep_ = (ppVar1->first).rep_ & 0xfffffffe ^ 2;
        }
        if (iVar5 < bound) {
          (ppVar1->first).rep_ = 2;
          uVar4 = 0;
        }
        else {
          uVar4 = (ulong)((ppVar1->first).rep_ & 0xfffffffe) ^ 2;
        }
        ProgramBuilder::addMinLit
                  (&this->super_ProgramBuilder,0,(WeightLiteral)((ulong)(uint)cw << 0x20 | uVar4));
        W.rep_ = 1;
        goto LAB_001576ea;
      }
      uVar3 = getAuxVar(this);
      W.rep_ = uVar3 << 2;
      ProgramBuilder::addMinLit
                (&this->super_ProgramBuilder,0,(WeightLiteral)(CONCAT44(cw,W.rep_) + 2));
    }
    CVar6 = WeightConstraint::create
                      (*(((this->super_ProgramBuilder).ctx_)->solvers_).ebo_.buf,W,lits,bound,
                       (uint)eq << 5);
    W.rep_ = (uint32)(CVar6.con[1] != (WeightConstraint *)0x1 &&
                     CVar6.con[0] != (WeightConstraint *)0x1);
  }
LAB_001576ea:
  return SUB41(W.rep_,0);
}

Assistant:

bool PBBuilder::addConstraint(WeightLitVec& lits, weight_t bound, bool eq, weight_t cw) {
	if (!ctx()->ok()) { return false; }
	Var eqVar = 0;
	if (cw > 0) { // soft constraint
		if (lits.size() != 1) {
			eqVar = getAuxVar();
			addMinLit(0, WeightLiteral(negLit(eqVar), cw));
		}
		else {
			if (lits[0].second < 0)    { bound += (lits[0].second = -lits[0].second); lits[0].first = ~lits[0].first; }
			if (lits[0].second < bound){ lits[0].first = lit_false(); }
			addMinLit(0, WeightLiteral(~lits[0].first, cw));
			return true;
		}
	}
	return WeightConstraint::create(*ctx()->master(), posLit(eqVar), lits, bound, !eq ? 0 : WeightConstraint::create_eq_bound).ok();
}